

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSelectionMerge
          (InstructionBuilder *this,uint32_t merge_id,uint32_t selection_control)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *pIVar1;
  IRContext *c;
  Operand *local_130;
  allocator<spvtools::opt::Operand> local_125;
  uint32_t local_124;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  uint32_t local_e4;
  iterator local_e0;
  undefined8 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  Operand local_a8;
  Operand OStack_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_branch_merge;
  uint32_t selection_control_local;
  uint32_t merge_id_local;
  InstructionBuilder *this_local;
  
  new_branch_merge._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = selection_control
  ;
  new_branch_merge._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = merge_id;
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  local_e4 = new_branch_merge._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_e0 = &local_e4;
  local_d8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_e0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d0,init_list_00);
  Operand::Operand(&local_a8,SPV_OPERAND_TYPE_ID,&local_d0);
  local_124 = (uint32_t)
              new_branch_merge._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_120 = &local_124;
  local_118 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_120;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list);
  Operand::Operand(&OStack_78,SPV_OPERAND_TYPE_SELECTION_CONTROL,&local_110);
  local_48 = &local_a8;
  local_40 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_125);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_38,__l,&local_125);
  opt::Instruction::Instruction(pIVar1,c,OpSelectionMerge,0,0,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_125);
  local_130 = (Operand *)&local_48;
  do {
    local_130 = local_130 + -1;
    Operand::~Operand(local_130);
  } while (local_130 != &local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d0);
  pIVar1 = AddInstruction(this,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  return pIVar1;
}

Assistant:

Instruction* AddSelectionMerge(
      uint32_t merge_id, uint32_t selection_control = static_cast<uint32_t>(
                             spv::SelectionControlMask::MaskNone)) {
    std::unique_ptr<Instruction> new_branch_merge(new Instruction(
        GetContext(), spv::Op::OpSelectionMerge, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {merge_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_SELECTION_CONTROL,
          {selection_control}}}));
    return AddInstruction(std::move(new_branch_merge));
  }